

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O3

int stbir__resize_arbitrary
              (void *alloc_context,void *input_data,int input_w,int input_h,
              int input_stride_in_bytes,void *output_data,int output_w,int output_h,
              int output_stride_in_bytes,float s0,float t0,float s1,float t1,float *transform,
              int channels,int alpha_channel,stbir_uint32 flags,stbir_datatype type,
              stbir_filter h_filter,stbir_filter v_filter,stbir_edge edge_horizontal,
              stbir_edge edge_vertical,stbir_colorspace colorspace)

{
  uint uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint uVar5;
  stbir_datatype sVar6;
  stbir_filter filter;
  stbir_colorspace sVar7;
  int iVar8;
  float *pfVar9;
  float *encode_buffer;
  stbir_uint32 sVar10;
  stbir_uint32 sVar11;
  int iVar12;
  stbir__contributors *contributors;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  undefined4 in_register_00000084;
  ulong uVar24;
  stbir__contributors *contributors_00;
  ulong uVar25;
  int iVar26;
  float *pfVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  double dVar31;
  double dVar32;
  float extraout_XMM0_Db;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined4 in_stack_0000001c;
  int local_1f8;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  int local_1a0;
  undefined1 local_158 [64];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  uint local_10c;
  int local_108;
  uint local_104;
  stbir_datatype local_100;
  stbir_datatype local_fc;
  stbir_filter local_f8;
  stbir_edge local_f4;
  stbir_edge local_f0;
  stbir_colorspace local_ec;
  stbir__contributors *local_e8;
  float *local_e0;
  stbir__contributors *local_d8;
  float *local_d0;
  int local_c8;
  float *local_c0;
  float *local_b8;
  undefined8 local_b0;
  int iStack_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_90;
  int local_8c;
  undefined8 local_88;
  int local_80;
  float *local_78;
  float *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  float *local_48;
  undefined8 uStack_40;
  stbir__contributors *local_38;
  
  local_158._8_4_ = SUB84(input_data,0);
  local_158._32_4_ = SUB84(output_data,0);
  local_158._36_4_ = output_w;
  local_10c = (uint)transform;
  if ((undefined1 (*) [16])CONCAT44(in_stack_0000001c,output_stride_in_bytes) ==
      (undefined1 (*) [16])0x0) {
    auVar37._12_4_ = (float)output_w;
    auVar37._8_4_ = (float)(int)local_158._32_4_;
    auVar37._4_4_ = 0;
    auVar37._0_4_ = output_w;
    auVar33._4_4_ = t0;
    auVar33._0_4_ = s0;
    auVar33._8_4_ = (float)(int)local_158._8_4_;
    auVar33._12_4_ = (float)input_w;
    auVar38._4_4_ = (float)output_w * t0;
    auVar38._0_4_ = (float)(int)local_158._32_4_ * s0;
    auVar35 = divps(auVar37,auVar33);
    auVar38._8_8_ = auVar35._8_8_;
    auVar35._4_4_ = t1 - t0;
    auVar35._0_4_ = s1 - s0;
    auVar35._8_4_ = s1 - s0;
    auVar35._12_4_ = t1 - t0;
    register0x00001300 = divps(auVar38,auVar35);
  }
  else {
    auVar35 = *(undefined1 (*) [16])CONCAT44(in_stack_0000001c,output_stride_in_bytes);
    register0x00001300 = auVar35._8_8_;
    fStack_114 = (float)auVar35._0_4_;
    fStack_110 = (float)auVar35._4_4_;
  }
  local_fc = local_158._68_4_ <= 1.0 | STBIR_MAX_TYPES;
  if (type != STBIR_TYPE_UINT8) {
    local_fc = type;
  }
  local_f8 = local_158._72_4_ <= 1.0 | STBIR_FILTER_CATMULLROM;
  if (h_filter != STBIR_FILTER_DEFAULT) {
    local_f8 = h_filter;
  }
  local_158._12_4_ = input_w;
  local_158._44_4_ = s0;
  local_158._48_4_ = t0;
  local_158._52_4_ = s1;
  local_158._56_4_ = t1;
  sVar10 = stbir__calculate_memory((stbir__info *)local_158);
  uVar23 = (ulong)sVar10;
  contributors = (stbir__contributors *)malloc(uVar23);
  if (contributors == (stbir__contributors *)0x0) {
    return 0;
  }
  sVar11 = stbir__calculate_memory((stbir__info *)local_158);
  filter = local_f8;
  sVar6 = local_fc;
  uVar5 = local_10c;
  if (input_h == 0) {
    input_h = (uint)"\x01\x02\x04\x04"[flags] * local_158._8_4_ * local_10c;
  }
  if (output_h == 0) {
    output_h = (uint)"\x01\x02\x04\x04"[flags] * local_158._32_4_ * local_10c;
  }
  if ((int)local_10c < 0) {
    __assert_fail("info->channels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x909,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  if (0x40 < local_10c) {
    __assert_fail("info->channels <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x90a,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  uVar22 = (ulong)local_fc;
  if (5 < uVar22) {
    __assert_fail("info->horizontal_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x90f,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  uVar24 = (ulong)local_f8;
  local_38 = contributors;
  if (5 < uVar24) {
    __assert_fail("info->vertical_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x910,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  uVar1 = alpha_channel | 3;
  if (-1 < channels) {
    uVar1 = alpha_channel;
  }
  if (((~uVar1 & 3) != 0) && ((channels < 0 || (local_10c <= (uint)channels)))) {
    __assert_fail("alpha_channel >= 0 && alpha_channel < info->channels",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x91b,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  iVar14 = 0;
  if (channels < (int)local_10c) {
    if (sVar10 < sVar11) {
      __assert_fail("tempmem_size_in_bytes >= memory_required",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x926,
                    "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                   );
    }
    memset(contributors,0,uVar23);
    local_108 = channels;
    local_100 = flags;
    local_f4 = v_filter;
    local_f0 = edge_horizontal;
    local_ec = edge_vertical;
    fVar30 = fStack_114;
    local_158._0_8_ = alloc_context;
    local_158._16_4_ = input_h;
    local_158._24_8_ = (void *)CONCAT44(in_register_00000084,input_stride_in_bytes);
    local_158._40_4_ = output_h;
    local_104 = uVar1;
    fVar28 = (*stbir__filter_info_table[uVar22].support)
                       ((float)(-(uint)(fStack_114 <= 1.0) & (uint)fStack_114 |
                               ~-(uint)(fStack_114 <= 1.0) & (uint)(1.0 / fStack_114)));
    local_1b8._4_4_ = fStack_110;
    fVar36 = 0.0;
    local_48 = (float *)(ulong)(uint)(1.0 / fStack_110);
    uStack_40 = 0;
    fVar29 = (*stbir__filter_info_table[uVar24].support)
                       ((float)(-(uint)(fStack_110 <= 1.0) & (uint)fStack_110 |
                               ~-(uint)(fStack_110 <= 1.0) & (uint)(1.0 / fStack_110)));
    fVar28 = ceilf(fVar28 + fVar28);
    fVar29 = ceilf(fVar29 + fVar29);
    local_b0._0_4_ = (int)fVar28;
    iStack_ac = (int)fVar29;
    local_a8 = stbir__get_filter_pixel_width(sVar6,fVar30);
    local_a4 = stbir__get_filter_pixel_width(filter,(float)local_1b8._4_4_);
    iVar14 = stbir__get_filter_pixel_width(sVar6,fVar30);
    local_a0 = iVar14 / 2;
    iVar12 = stbir__get_filter_pixel_width(filter,(float)local_1b8._4_4_);
    iVar12 = iVar12 / 2;
    local_90 = uVar5 * local_158._32_4_ * 4;
    local_c8 = (iVar14 - (iVar14 >> 0x1f) & 0xfffffffeU) + local_158._8_4_;
    local_e0 = (float *)((long)&contributors->n0 + (long)local_68);
    contributors_00 = (stbir__contributors *)((long)local_64 + (long)local_e0);
    pfVar27 = (float *)((long)&contributors_00->n0 + (long)local_60);
    local_c0 = (float *)((long)local_5c + (long)pfVar27);
    lVar17 = (long)&contributors->n0 + uVar23;
    local_e8 = contributors;
    local_d8 = contributors_00;
    local_d0 = pfVar27;
    local_9c = iVar12;
    if (1.0 < (float)local_1b8._4_4_) {
      local_b8 = (float *)0x0;
      local_78 = (float *)((long)local_c0 + (long)local_58);
      local_70 = (float *)((long)local_50 + (long)local_78);
      if (lVar17 != (long)local_4c + (long)local_70) {
        __assert_fail("(size_t)(unsigned char*)(((unsigned char*)info->encode_buffer) + info->encode_buffer_size) == (size_t)tempmem + tempmem_size_in_bytes"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x952,
                      "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                     );
      }
    }
    else {
      local_b8 = (float *)((long)local_c0 + (long)local_58);
      local_78 = (float *)((long)local_54 + (long)local_b8);
      local_70 = (float *)0x0;
      if (lVar17 != (long)local_50 + (long)local_78) {
        __assert_fail("(size_t)(unsigned char*)(((unsigned char*)info->ring_buffer) + info->ring_buffer_size) == (size_t)tempmem + tempmem_size_in_bytes"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x95a,
                      "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                     );
      }
    }
    local_80 = -1;
    stbir__calculate_filters
              (contributors,local_e0,local_fc,fVar30,(float)local_158._60_4_,local_158._8_4_,
               local_158._32_4_);
    uVar4 = local_158._36_4_;
    uVar2 = local_158._12_4_;
    uVar23 = (ulong)local_f8;
    stbir__calculate_filters
              (contributors_00,pfVar27,local_f8,(float)local_1b8._4_4_,fStack_118,local_158._12_4_,
               local_158._36_4_);
    if (1.0 < (float)local_1b8._4_4_) {
      fVar30 = (*stbir__filter_info_table[uVar23].support)(local_48._0_4_);
      iVar14 = 1;
      if ((int)uVar4 < 1) goto LAB_001368d0;
      local_1b8._0_4_ = local_1b8._4_4_;
      fStack_1b0 = (float)local_1b8._4_4_;
      fStack_1ac = (float)local_1b8._4_4_;
      lVar17 = 0;
      fVar28 = extraout_XMM0_Db;
      do {
        iVar12 = (int)lVar17;
        auVar34._0_4_ = fStack_118 + fVar30 * (float)local_1b8._4_4_ + (float)iVar12 + 0.5;
        auVar34._4_4_ = fStack_118 + (((float)iVar12 + 0.5) - fVar30 * (float)local_1b8._4_4_);
        auVar34._8_4_ = fStack_118 + fVar28;
        auVar34._12_4_ = fStack_118 + fVar36;
        auVar35 = divps(auVar34,_local_1b8);
        dVar31 = floor((double)auVar35._0_4_ + -0.5);
        dVar32 = floor((double)auVar35._4_4_ + 0.5);
        iVar14 = (int)dVar32;
        if (local_8c <= (int)dVar31 - iVar14) {
          __assert_fail("in_last_scanline - in_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x81f,"void stbir__buffer_loop_upsample(stbir__info *)");
        }
        if (-1 < local_80) {
          iVar20 = local_88._4_4_;
          if (iVar14 <= (int)local_88) goto LAB_00136399;
          iVar26 = (int)local_88;
          do {
            iVar26 = iVar26 + 1;
            if (iVar26 - iVar20 == 1) {
              local_80 = -1;
              local_88._0_4_ = 0;
              local_88._4_4_ = 0;
              goto LAB_0013638d;
            }
            local_88._0_4_ = iVar26;
            local_80 = (local_80 + 1) % local_8c;
          } while (iVar26 != iVar14);
          if (-1 < local_80) goto LAB_00136399;
        }
LAB_0013638d:
        while( true ) {
          stbir__decode_and_resample_upsample((stbir__info *)local_158,iVar14);
          iVar20 = local_88._4_4_;
LAB_00136399:
          encode_buffer = local_70;
          pfVar9 = local_78;
          iVar26 = local_80;
          iVar14 = local_8c;
          pfVar27 = local_d0;
          sVar7 = local_ec;
          sVar6 = local_100;
          uVar5 = local_10c;
          uVar2 = local_158._32_4_;
          uVar3 = local_158._24_8_;
          if ((int)dVar31 <= iVar20) break;
          iVar14 = iVar20 + 1;
        }
        if (fStack_110 <= 1.0) {
          __assert_fail("stbir__use_height_upsampling(stbir_info)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x76a,"void stbir__resample_vertical_upsample(stbir__info *, int)");
        }
        lVar21 = (long)(int)local_158._32_4_;
        uVar22 = (ulong)(uint)local_158._32_4_;
        uVar23 = (ulong)local_10c;
        local_48 = (float *)CONCAT44(local_48._4_4_,local_108);
        iVar16 = local_90 >> 2;
        lVar18 = (long)iStack_ac * (long)iVar12;
        iVar20 = local_d8[lVar17].n1;
        iVar15 = local_d8[lVar17].n0;
        iVar8 = (int)local_88;
        lVar13 = (long)(int)local_158._40_4_;
        memset(local_70,0,lVar21 * (int)local_10c * 4);
        local_1a0 = (int)lVar18;
        switch(uVar5) {
        case 1:
          if (iVar15 <= iVar20) {
            iVar20 = iVar20 - iVar15;
            uVar23 = 0;
            do {
              if (0 < (int)uVar2) {
                fVar28 = pfVar27[(long)local_1a0 + uVar23];
                uVar24 = 0;
                do {
                  encode_buffer[uVar24] =
                       pfVar9[(long)((((iVar26 - iVar8) + iVar15) % iVar14) * iVar16) + uVar24] *
                       fVar28 + encode_buffer[uVar24];
                  uVar24 = uVar24 + 1;
                } while (uVar22 != uVar24);
              }
              uVar23 = uVar23 + 1;
              iVar15 = iVar15 + 1;
            } while (uVar23 != iVar20 + 1);
          }
          break;
        case 2:
          if (iVar15 <= iVar20) {
            iVar20 = iVar20 - iVar15;
            uVar23 = 0;
            do {
              if (0 < (int)uVar2) {
                lVar18 = (long)((((iVar26 - iVar8) + iVar15) % iVar14) * iVar16);
                fVar28 = pfVar27[(long)local_1a0 + uVar23];
                uVar24 = 0;
                do {
                  encode_buffer[uVar24 * 2] =
                       pfVar9[lVar18 + uVar24 * 2] * fVar28 + encode_buffer[uVar24 * 2];
                  encode_buffer[uVar24 * 2 + 1] =
                       pfVar9[lVar18 + uVar24 * 2 + 1] * fVar28 + encode_buffer[uVar24 * 2 + 1];
                  uVar24 = uVar24 + 1;
                } while (uVar22 != uVar24);
              }
              uVar23 = uVar23 + 1;
              iVar15 = iVar15 + 1;
            } while (uVar23 != iVar20 + 1);
          }
          break;
        case 3:
          if (iVar15 <= iVar20) {
            iVar20 = iVar20 - iVar15;
            uVar23 = 0;
            do {
              if (0 < (int)uVar2) {
                fVar28 = pfVar27[(long)local_1a0 + uVar23];
                lVar18 = (long)((((iVar26 - iVar8) + iVar15) % iVar14) * iVar16) * 4;
                lVar21 = 0;
                do {
                  *(float *)((long)encode_buffer + lVar21) =
                       *(float *)((long)pfVar9 + lVar21 + lVar18) * fVar28 +
                       *(float *)((long)encode_buffer + lVar21);
                  *(float *)((long)encode_buffer + lVar21 + 4) =
                       *(float *)((long)pfVar9 + lVar21 + lVar18 + 4) * fVar28 +
                       *(float *)((long)encode_buffer + lVar21 + 4);
                  *(float *)((long)encode_buffer + lVar21 + 8) =
                       *(float *)((long)pfVar9 + lVar21 + lVar18 + 8) * fVar28 +
                       *(float *)((long)encode_buffer + lVar21 + 8);
                  lVar21 = lVar21 + 0xc;
                } while (uVar22 * 0xc != lVar21);
              }
              uVar23 = uVar23 + 1;
              iVar15 = iVar15 + 1;
            } while (uVar23 != iVar20 + 1);
          }
          break;
        case 4:
          if (iVar15 <= iVar20) {
            iVar20 = iVar20 - iVar15;
            uVar23 = 0;
            do {
              if (0 < (int)uVar2) {
                fVar28 = pfVar27[lVar18 + uVar23];
                lVar21 = (long)((((iVar26 - iVar8) + iVar15) % iVar14) * iVar16) * 4;
                lVar19 = 0;
                do {
                  *(float *)((long)encode_buffer + lVar19) =
                       *(float *)((long)pfVar9 + lVar19 + lVar21) * fVar28 +
                       *(float *)((long)encode_buffer + lVar19);
                  *(float *)((long)encode_buffer + lVar19 + 4) =
                       *(float *)((long)pfVar9 + lVar19 + lVar21 + 4) * fVar28 +
                       *(float *)((long)encode_buffer + lVar19 + 4);
                  *(float *)((long)encode_buffer + lVar19 + 8) =
                       *(float *)((long)pfVar9 + lVar19 + lVar21 + 8) * fVar28 +
                       *(float *)((long)encode_buffer + lVar19 + 8);
                  *(float *)((long)encode_buffer + lVar19 + 0xc) =
                       *(float *)((long)pfVar9 + lVar19 + lVar21 + 0xc) * fVar28 +
                       *(float *)((long)encode_buffer + lVar19 + 0xc);
                  lVar19 = lVar19 + 0x10;
                } while (uVar22 << 4 != lVar19);
              }
              uVar23 = uVar23 + 1;
              iVar15 = iVar15 + 1;
            } while (uVar23 != iVar20 + 1);
          }
          break;
        default:
          if (iVar15 <= iVar20) {
            iVar20 = iVar20 - iVar15;
            uVar22 = 0;
            do {
              if (0 < (int)uVar2) {
                fVar28 = pfVar27[(long)local_1a0 + uVar22];
                uVar24 = 0;
                lVar18 = 0;
                do {
                  if (0 < (int)uVar5) {
                    uVar25 = 0;
                    do {
                      encode_buffer[uVar24 + uVar25] =
                           pfVar9[(long)((((iVar26 - iVar8) + iVar15) % iVar14) * iVar16) +
                                  uVar24 + uVar25] * fVar28 + encode_buffer[uVar24 + uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar23 != uVar25);
                  }
                  lVar18 = lVar18 + 1;
                  uVar24 = (ulong)((int)uVar24 + uVar5);
                } while (lVar18 != lVar21);
              }
              uVar22 = uVar22 + 1;
              iVar15 = iVar15 + 1;
            } while (uVar22 != iVar20 + 1);
          }
        }
        stbir__encode_scanline
                  ((stbir__info *)local_158,uVar2,(void *)(uVar3 + lVar13 * iVar12),encode_buffer,
                   uVar5,(int)local_48._0_4_,sVar7 + sVar6 * 2);
        lVar17 = lVar17 + 1;
        fVar28 = 0.0;
      } while (lVar17 < (int)local_158._36_4_);
    }
    else {
      fVar30 = (*stbir__filter_info_table[uVar23].support)((float)local_1b8._4_4_);
      iVar26 = uVar2 + iVar12;
      iVar20 = -iVar12;
      iVar14 = uVar4;
      if (iVar26 != iVar20 && SBORROW4(iVar26,iVar20) == iVar26 + iVar12 < 0) {
        local_1f8 = local_8c;
        do {
          fVar28 = (((float)iVar20 + 0.5) - fVar30 / (float)local_1b8._4_4_) *
                   (float)local_1b8._4_4_ - fStack_118;
          dVar31 = floor((double)((fVar30 / (float)local_1b8._4_4_ + (float)iVar20 + 0.5) *
                                  (float)local_1b8._4_4_ - fStack_118) + -0.5);
          dVar32 = floor((double)fVar28 + 0.5);
          iVar14 = (int)dVar31;
          iVar12 = (int)dVar32;
          if (local_1f8 <= iVar14 - iVar12) {
            __assert_fail("out_last_scanline - out_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                          ,0x884,"void stbir__buffer_loop_downsample(stbir__info *)");
          }
          if (iVar12 < (int)uVar4 && -1 < iVar14) {
            stbir__empty_ring_buffer((stbir__info *)local_158,iVar12);
            stbir__decode_scanline((stbir__info *)local_158,iVar20);
            pfVar27 = local_b8;
            memset(local_b8,0,(long)(int)local_10c * (long)(int)local_158._32_4_ * 4);
            if (1.0 < fStack_114) {
              stbir__resample_horizontal_upsample((stbir__info *)local_158,pfVar27);
            }
            else {
              stbir__resample_horizontal_downsample((stbir__info *)local_158,pfVar27);
            }
            if (local_80 < 0) {
              stbir__add_empty_ring_buffer_entry((stbir__info *)local_158,iVar12);
            }
            while (local_88._4_4_ < iVar14) {
              stbir__add_empty_ring_buffer_entry((stbir__info *)local_158,local_88._4_4_ + 1);
            }
            if (1.0 < fStack_110) {
              __assert_fail("!stbir__use_height_upsampling(stbir_info)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                            ,0x7d5,"void stbir__resample_vertical_downsample(stbir__info *, int)");
            }
            lVar17 = (long)iVar20 + (long)local_9c;
            iVar14 = local_d8[lVar17].n0;
            iVar12 = local_d8[lVar17].n1;
            local_1f8 = local_8c;
            if (iVar14 <= iVar12) {
              uVar23 = (ulong)(uint)local_158._32_4_;
              iVar15 = (int)lVar17 * iStack_ac - iVar14;
              local_48 = local_78 + 3;
              do {
                fVar28 = local_d0[iVar15 + iVar14];
                lVar17 = (long)((((local_80 - (int)local_88) + iVar14) % local_8c) * (local_90 >> 2)
                               );
                switch(local_10c) {
                case 1:
                  if (0 < (int)local_158._32_4_) {
                    uVar22 = 0;
                    do {
                      local_78[lVar17 + uVar22] =
                           local_b8[uVar22] * fVar28 + local_78[lVar17 + uVar22];
                      uVar22 = uVar22 + 1;
                    } while (uVar23 != uVar22);
                  }
                  break;
                case 2:
                  if (0 < (int)local_158._32_4_) {
                    uVar22 = 0;
                    do {
                      local_78[lVar17 + uVar22 * 2] =
                           local_b8[uVar22 * 2] * fVar28 + local_78[lVar17 + uVar22 * 2];
                      local_78[lVar17 + uVar22 * 2 + 1] =
                           local_b8[uVar22 * 2 + 1] * fVar28 + local_78[lVar17 + uVar22 * 2 + 1];
                      uVar22 = uVar22 + 1;
                    } while (uVar23 != uVar22);
                  }
                  break;
                case 3:
                  if (0 < (int)local_158._32_4_) {
                    lVar17 = lVar17 * 4;
                    lVar13 = 0;
                    do {
                      *(float *)((long)local_78 + lVar13 + lVar17) =
                           *(float *)((long)local_b8 + lVar13) * fVar28 +
                           *(float *)((long)local_78 + lVar13 + lVar17);
                      *(float *)((long)local_78 + lVar13 + lVar17 + 4) =
                           *(float *)((long)local_b8 + lVar13 + 4) * fVar28 +
                           *(float *)((long)local_78 + lVar13 + lVar17 + 4);
                      *(float *)((long)local_78 + lVar13 + lVar17 + 8) =
                           *(float *)((long)local_b8 + lVar13 + 8) * fVar28 +
                           *(float *)((long)local_78 + lVar13 + lVar17 + 8);
                      lVar13 = lVar13 + 0xc;
                    } while (uVar23 * 0xc != lVar13);
                  }
                  break;
                case 4:
                  if (0 < (int)local_158._32_4_) {
                    lVar13 = 0;
                    do {
                      *(float *)((long)local_48 + lVar13 + lVar17 * 4 + -0xc) =
                           *(float *)((long)local_b8 + lVar13) * fVar28 +
                           *(float *)((long)local_48 + lVar13 + lVar17 * 4 + -0xc);
                      *(float *)((long)local_48 + lVar13 + lVar17 * 4 + -8) =
                           *(float *)((long)local_b8 + lVar13 + 4) * fVar28 +
                           *(float *)((long)local_48 + lVar13 + lVar17 * 4 + -8);
                      *(float *)((long)local_48 + lVar13 + lVar17 * 4 + -4) =
                           *(float *)((long)local_b8 + lVar13 + 8) * fVar28 +
                           *(float *)((long)local_48 + lVar13 + lVar17 * 4 + -4);
                      *(float *)((long)local_48 + lVar13 + lVar17 * 4) =
                           *(float *)((long)local_b8 + lVar13 + 0xc) * fVar28 +
                           *(float *)((long)local_48 + lVar13 + lVar17 * 4);
                      lVar13 = lVar13 + 0x10;
                    } while (uVar23 << 4 != lVar13);
                  }
                  break;
                default:
                  if (0 < (int)local_158._32_4_) {
                    uVar22 = 0;
                    uVar24 = 0;
                    do {
                      if (0 < (int)local_10c) {
                        uVar25 = 0;
                        do {
                          local_78[lVar17 + uVar22 + uVar25] =
                               local_b8[uVar22 + uVar25] * fVar28 +
                               local_78[lVar17 + uVar22 + uVar25];
                          uVar25 = uVar25 + 1;
                        } while (local_10c != uVar25);
                      }
                      uVar24 = uVar24 + 1;
                      uVar22 = (ulong)((int)uVar22 + local_10c);
                    } while (uVar24 != uVar23);
                  }
                }
                iVar14 = iVar14 + 1;
              } while (iVar12 + 1 != iVar14);
            }
          }
          iVar20 = iVar20 + 1;
          iVar14 = local_158._36_4_;
        } while (iVar20 != iVar26);
      }
      stbir__empty_ring_buffer((stbir__info *)local_158,iVar14);
    }
    iVar14 = 1;
  }
LAB_001368d0:
  free(local_38);
  return iVar14;
}

Assistant:

static int stbir__resize_arbitrary(
    void *alloc_context,
    const void* input_data, int input_w, int input_h, int input_stride_in_bytes,
    void* output_data, int output_w, int output_h, int output_stride_in_bytes,
    float s0, float t0, float s1, float t1, float *transform,
    int channels, int alpha_channel, stbir_uint32 flags, stbir_datatype type,
    stbir_filter h_filter, stbir_filter v_filter,
    stbir_edge edge_horizontal, stbir_edge edge_vertical, stbir_colorspace colorspace)
{
    stbir__info info;
    int result;
    size_t memory_required;
    void* extra_memory;

    stbir__setup(&info, input_w, input_h, output_w, output_h, channels);
    stbir__calculate_transform(&info, s0,t0,s1,t1,transform);
    stbir__choose_filter(&info, h_filter, v_filter);
    memory_required = stbir__calculate_memory(&info);
    extra_memory = STBIR_MALLOC(memory_required, alloc_context);

    if (!extra_memory)
        return 0;

    result = stbir__resize_allocated(&info, input_data, input_stride_in_bytes,
                                            output_data, output_stride_in_bytes,
                                            alpha_channel, flags, type,
                                            edge_horizontal, edge_vertical,
                                            colorspace, extra_memory, memory_required);

    STBIR_FREE(extra_memory, alloc_context);

    return result;
}